

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

SymbolVisibility __thiscall google::protobuf::Symbol::visibility_keyword(Symbol *this)

{
  byte bVar1;
  SymbolBase *pSVar2;
  
  pSVar2 = this->ptr_;
  if (pSVar2->symbol_type_ == '\x04') {
    bVar1 = pSVar2[1].symbol_type_ >> 2;
  }
  else {
    if (pSVar2->symbol_type_ != '\x01') {
      return VISIBILITY_UNSET;
    }
    bVar1 = pSVar2[2].symbol_type_;
  }
  return bVar1 & (VISIBILITY_EXPORT|VISIBILITY_LOCAL);
}

Assistant:

Type type() const { return static_cast<Type>(ptr_->symbol_type_); }